

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

bool __thiscall ON_ClippingPlaneSurface::Write(ON_ClippingPlaneSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    if (bVar1) {
      bVar2 = ON_PlaneSurface::Write(&this->super_ON_PlaneSurface,file);
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
      bVar1 = bVar1 && bVar2;
    }
    if (bVar1 != false) {
      bVar1 = ON_ClippingPlane::Write(&this->m_clipping_plane,file);
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

bool ON_ClippingPlaneSurface::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;

  for(;;)
  {
    rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,0);
    if (rc)
    {
      rc = ON_PlaneSurface::Write(file)?true:false;
      if (!file.EndWrite3dmChunk())
        rc = false;
    }
    if (!rc) break;

    rc = m_clipping_plane.Write(file);
    if (rc) break;

    break;
  }

  if (!file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}